

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_mat_csr_tvec(axbMat_s *A,axbVec_s *x,axbVec_s *ATx,void *aux_data)

{
  double dVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  int local_6c;
  int j;
  double xi;
  size_t i_1;
  size_t i;
  double *d_ATx;
  double *d_x;
  double *A_values;
  int *A_col_indices;
  int *A_row_markers;
  void *aux_data_local;
  axbVec_s *ATx_local;
  axbVec_s *x_local;
  axbMat_s *A_local;
  
  pvVar2 = A->row_markers;
  pvVar3 = A->col_indices;
  pvVar4 = A->values;
  pvVar5 = x->data;
  pvVar6 = ATx->data;
  for (i_1 = 0; i_1 < A->cols; i_1 = i_1 + 1) {
    *(undefined8 *)((long)pvVar6 + i_1 * 8) = 0;
  }
  for (xi = 0.0; (ulong)xi < A->rows; xi = (double)((long)xi + 1)) {
    dVar1 = *(double *)((long)pvVar5 + (long)xi * 8);
    for (local_6c = *(int *)((long)pvVar2 + (long)xi * 4);
        local_6c < *(int *)((long)pvVar2 + (long)xi * 4 + 4); local_6c = local_6c + 1) {
      lVar7 = (long)*(int *)((long)pvVar3 + (long)local_6c * 4);
      *(double *)((long)pvVar6 + lVar7 * 8) =
           *(double *)((long)pvVar4 + (long)local_6c * 8) * dVar1 +
           *(double *)((long)pvVar6 + lVar7 * 8);
    }
  }
  return 0;
}

Assistant:

static axbStatus_t op_mat_csr_tvec(struct axbMat_s *A, struct axbVec_s *x, struct axbVec_s *ATx, void *aux_data)
{
  (void)aux_data;

  const int    *A_row_markers = (const int*)A->row_markers;
  const int    *A_col_indices = (const int*)A->col_indices;
  const double *A_values      = (const double*)A->values;
  const double *d_x           = (const double*)x->data;

  double *d_ATx = (double*)ATx->data;

  for (size_t i=0; i<A->cols; ++i) d_ATx[i] = 0;

  for (size_t i=0; i<A->rows; ++i) {
    double xi = d_x[i];
    for (int j=A_row_markers[i]; j < A_row_markers[i+1]; ++j) {
      d_ATx[A_col_indices[j]] += A_values[j] * xi;
    }
  }

  return 0;
}